

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadPathIdentifier(AsciiParser *this,string *path_identifier)

{
  ulong uVar1;
  int *piVar2;
  StreamReader *pSVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  int iVar7;
  long lVar8;
  uint8_t unaff_R13B;
  string WHITESPACE;
  stringstream ss;
  undefined1 *local_238;
  undefined8 local_230;
  undefined1 local_228;
  undefined7 uStack_227;
  long *local_218 [2];
  long local_208 [2];
  undefined4 *local_1f8;
  undefined8 local_1f0;
  undefined4 local_1e8;
  undefined2 uStack_1e4;
  undefined1 uStack_1e2;
  undefined1 uStack_1e1;
  long *local_1d8;
  long local_1d0;
  long local_1c8 [2];
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1b8);
  bVar6 = Expect(this,'<');
  if (bVar6) {
    bVar6 = SkipWhitespace(this);
    if (bVar6) {
      bVar6 = false;
      do {
        pSVar3 = this->_sr;
        uVar4 = pSVar3->length_;
        uVar5 = pSVar3->idx_;
        if ((uVar4 <= uVar5) || (pSVar3->binary_[uVar5] == '\0')) goto LAB_0033a4db;
        uVar1 = uVar5 + 1;
        if (uVar1 <= uVar4) {
          unaff_R13B = pSVar3->binary_[uVar5];
          pSVar3->idx_ = uVar1;
        }
        iVar7 = 1;
        if (uVar1 <= uVar4) {
          if (unaff_R13B == '>') {
            piVar2 = &(this->_curr_cursor).col;
            *piVar2 = *piVar2 + 1;
            bVar6 = true;
            iVar7 = 3;
          }
          else {
            local_1f8 = (undefined4 *)CONCAT71(local_1f8._1_7_,unaff_R13B);
            ::std::__ostream_insert<char,std::char_traits<char>>(local_1a8,(char *)&local_1f8,1);
            iVar7 = 0;
          }
        }
      } while (iVar7 == 0);
      if (iVar7 == 3) {
LAB_0033a4db:
        if (bVar6) {
          ::std::__cxx11::stringbuf::str();
          local_1e8 = 0x90d0a20;
          uStack_1e4 = 0xb0c;
          local_1f0 = 6;
          uStack_1e2 = 0;
          local_218[0] = local_208;
          local_1f8 = &local_1e8;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_218,local_1d8,local_1d0 + (long)local_1d8);
          lVar8 = ::std::__cxx11::string::find_first_not_of((char *)local_218,(ulong)local_1f8,0);
          if (lVar8 == -1) {
            local_230 = 0;
            local_228 = 0;
            local_238 = &local_228;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_238,(ulong)local_218);
          }
          ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_238);
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
          lVar8 = ::std::__cxx11::string::find_last_not_of
                            ((char *)local_218,(ulong)local_1f8,0xffffffffffffffff);
          if (lVar8 == -1) {
            local_230 = 0;
            local_228 = 0;
            local_238 = &local_228;
          }
          else {
            ::std::__cxx11::string::substr((ulong)&local_238,(ulong)local_218);
          }
          ::std::__cxx11::string::operator=((string *)local_218,(string *)&local_238);
          if (local_238 != &local_228) {
            operator_delete(local_238,CONCAT71(uStack_227,local_228) + 1);
          }
          if (local_1f8 != &local_1e8) {
            operator_delete(local_1f8,
                            CONCAT17(uStack_1e1,CONCAT16(uStack_1e2,CONCAT24(uStack_1e4,local_1e8)))
                            + 1);
          }
          ::std::__cxx11::string::operator=((string *)path_identifier,(string *)local_218);
          if (local_218[0] != local_208) {
            operator_delete(local_218[0],local_208[0] + 1);
          }
          if (local_1d8 != local_1c8) {
            operator_delete(local_1d8,local_1c8[0] + 1);
          }
          bVar6 = true;
          goto LAB_0033a57d;
        }
      }
    }
  }
  bVar6 = false;
LAB_0033a57d:
  ::std::__cxx11::stringstream::~stringstream(local_1b8);
  ::std::ios_base::~ios_base(local_138);
  return bVar6;
}

Assistant:

bool AsciiParser::ReadPathIdentifier(std::string *path_identifier) {
  // path_identifier = `<` string `>`
  std::stringstream ss;

  if (!Expect('<')) {
    return false;
  }

  if (!SkipWhitespace()) {
    return false;
  }

  // read until '>'
  bool ok = false;
  while (!Eof()) {
    char c;
    if (!Char1(&c)) {
      // this should not happen.
      return false;
    }

    if (c == '>') {
      // end
      ok = true;
      _curr_cursor.col++;
      break;
    }

    // TODO: Check if character is valid for path identifier
    ss << c;
  }

  if (!ok) {
    return false;
  }

  (*path_identifier) = TrimString(ss.str());
  // std::cout << "PathIdentifier: " << (*path_identifier) << "\n";

  return true;
}